

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.cpp
# Opt level: O1

unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *
jaegertracing::net::resolveAddress
          (unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *__return_storage_ptr__,
          string *host,int port,int family,int type)

{
  uint uVar1;
  int __ecode;
  char *pcVar2;
  runtime_error *this;
  uint uVar3;
  ulong uVar4;
  uint __val;
  uint __len;
  OSResource osResouce;
  addrinfo *servInfoPtr;
  string service;
  addrinfo hints;
  string __str;
  OSResource local_221;
  _Head_base<0UL,_addrinfo_*,_false> local_220;
  char *local_218;
  undefined8 local_210;
  char local_208 [16];
  addrinfo local_1f8;
  string local_1c8 [32];
  undefined1 local_1a8 [376];
  
  local_1f8.ai_canonname = (char *)0x0;
  local_1f8.ai_next = (addrinfo *)0x0;
  local_1f8.ai_addrlen = 0;
  local_1f8._20_4_ = 0;
  local_1f8.ai_addr = (sockaddr *)0x0;
  local_1f8._0_8_ = (ulong)(uint)family << 0x20;
  local_1f8.ai_protocol = 0;
  local_1f8.ai_socktype = type;
  local_218 = local_208;
  local_210 = 0;
  local_208[0] = '\0';
  if (port != 0) {
    __val = -port;
    if (0 < port) {
      __val = port;
    }
    __len = 1;
    if (9 < __val) {
      uVar4 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar3 = (uint)uVar4;
        if (uVar3 < 100) {
          __len = __len - 2;
          goto LAB_001e3951;
        }
        if (uVar3 < 1000) {
          __len = __len - 1;
          goto LAB_001e3951;
        }
        if (uVar3 < 10000) goto LAB_001e3951;
        uVar4 = uVar4 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar3);
      __len = __len + 1;
    }
LAB_001e3951:
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_1a8,(char)__len - (char)(port >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)port >> 0x1f) + local_1a8._0_8_),__len,__val);
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_);
    }
  }
  Socket::OSResource::OSResource(&local_221);
  local_220._M_head_impl = (addrinfo *)0x0;
  __ecode = getaddrinfo((host->_M_dataplus)._M_p,local_218,&local_1f8,(addrinfo **)&local_220);
  *(_Manager_type *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
           super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
           super__Tuple_impl<1UL,_jaegertracing::net::AddrInfoDeleter>.
           super__Head_base<1UL,_jaegertracing::net::AddrInfoDeleter,_false>._M_head_impl + 0x10) =
       (_Manager_type)0x0;
  *(_Invoker_type *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
           super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
           super__Tuple_impl<1UL,_jaegertracing::net::AddrInfoDeleter>.
           super__Head_base<1UL,_jaegertracing::net::AddrInfoDeleter,_false>._M_head_impl + 0x18) =
       (_Invoker_type)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
    super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
    super__Tuple_impl<1UL,_jaegertracing::net::AddrInfoDeleter>.
    super__Head_base<1UL,_jaegertracing::net::AddrInfoDeleter,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
           super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
           super__Tuple_impl<1UL,_jaegertracing::net::AddrInfoDeleter>.
           super__Head_base<1UL,_jaegertracing::net::AddrInfoDeleter,_false>._M_head_impl + 8) = 0;
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
  super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl = local_220._M_head_impl;
  if (__ecode != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error resolving address: ",0x19);
    pcVar2 = gai_strerror(__ecode);
    std::operator<<((ostream *)local_1a8,pcVar2);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,local_1c8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Socket::OSResource::~OSResource(&local_221);
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<::addrinfo, AddrInfoDeleter>
resolveAddress(const std::string& host, int port, int family, int type)
{
// On windows, getaddrinfo does not return an error for empty host
#ifdef WIN32
    if (host.empty()) {
        throw std::runtime_error("Error resolving address: ");
    }
#endif
    ::addrinfo hints;
    std::memset(&hints, 0, sizeof(hints));
    hints.ai_family = family;
    hints.ai_socktype = type;

    std::string service;
    if (port != 0) {
        service = std::to_string(port);
    }

    Socket::OSResource osResouce;

    auto* servInfoPtr = static_cast<::addrinfo*>(nullptr);
    const auto returnCode =
        getaddrinfo(host.c_str(), service.c_str(), &hints, &servInfoPtr);
    std::unique_ptr<::addrinfo, AddrInfoDeleter> servInfo(servInfoPtr);

    if (returnCode != 0) {
        std::ostringstream oss;
        oss << "Error resolving address: " << gai_strerror(returnCode);
        throw std::runtime_error(oss.str());
    }

    return servInfo;
}